

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O2

void __thiscall xLearn::DMATRIX_TEST_Compress_Test::TestBody(DMATRIX_TEST_Compress_Test *this)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> feature_list;
  DMatrix matrix;
  
  DMatrix::DMatrix(&matrix);
  DMatrix::Reset(&matrix);
  DMatrix::AddRow(&matrix);
  DMatrix::AddNode(&matrix,0,1,0.1,0);
  DMatrix::AddNode(&matrix,0,5,0.1,0);
  DMatrix::AddNode(&matrix,0,8,0.1,0);
  DMatrix::AddNode(&matrix,0,10,0.1,0);
  DMatrix::AddRow(&matrix);
  DMatrix::AddNode(&matrix,1,3,0.1,0);
  DMatrix::AddNode(&matrix,1,0xc,0.1,0);
  DMatrix::AddNode(&matrix,1,0x14,0.1,0);
  DMatrix::AddRow(&matrix);
  DMatrix::AddNode(&matrix,2,5,0.1,0);
  DMatrix::AddNode(&matrix,2,8,0.1,0);
  DMatrix::AddNode(&matrix,2,0xb,0.1,0);
  DMatrix::AddRow(&matrix);
  DMatrix::AddNode(&matrix,3,2,0.1,0);
  DMatrix::AddNode(&matrix,3,4,0.1,0);
  DMatrix::AddNode(&matrix,3,7,0.1,0);
  feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DMatrix::Compress(&matrix,&feature_list);
  pvVar1 = *matrix.row.
            super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_a8.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[0].feat_id","1",
             &((pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_start)->feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[1].feat_id","5",
             &(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start[1].feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[2].feat_id","7",
             &(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start[2].feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[3].feat_id","8",
             &(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start[3].feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pvVar1 = matrix.row.
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[1];
  local_a8.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[0].feat_id","3",
             &((pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_start)->feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[1].feat_id","10",
             &(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start[1].feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 0xb;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[2].feat_id","11",
             &(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start[2].feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xda,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pvVar1 = matrix.row.
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[2];
  local_a8.ptr_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[0].feat_id","5",
             &((pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_start)->feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xdd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[1].feat_id","7",
             &(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start[1].feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 9;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[2].feat_id","9",
             &(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start[2].feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xdf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pvVar1 = matrix.row.
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[3];
  local_a8.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[0].feat_id","2",
             &((pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_start)->feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[1].feat_id","4",
             &(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start[1].feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"(*row)[2].feat_id","6",
             &(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start[2].feat_id,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[0]","1",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[1]","2",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[2]","3",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 2,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[3]","4",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 3,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[4]","5",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 4,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[5]","7",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 5,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[6]","8",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 6,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[7]","10",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 7,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 0xb;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[8]","11",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 8,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[9]","12",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 9,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.ptr_._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"feature_list[10]","20",
             feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 10,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  DMatrix::~DMatrix(&matrix);
  return;
}

Assistant:

TEST(DMATRIX_TEST, Compress) {
  // Init matrix
  DMatrix matrix;
  matrix.Reset();
  // row_0
  matrix.AddRow();
  matrix.AddNode(0, 1, 0.1);
  matrix.AddNode(0, 5, 0.1);
  matrix.AddNode(0, 8, 0.1);
  matrix.AddNode(0, 10, 0.1);
  // row_1
  matrix.AddRow();
  matrix.AddNode(1, 3, 0.1);
  matrix.AddNode(1, 12, 0.1);
  matrix.AddNode(1, 20, 0.1);
  // row_2
  matrix.AddRow();
  matrix.AddNode(2, 5, 0.1);
  matrix.AddNode(2, 8, 0.1);
  matrix.AddNode(2, 11, 0.1);
  // row_3
  matrix.AddRow();
  matrix.AddNode(3, 2, 0.1);
  matrix.AddNode(3, 4, 0.1);
  matrix.AddNode(3, 7, 0.1);
  // Compress
  std::vector<index_t> feature_list;
  matrix.Compress(feature_list);
  // row_0
  SparseRow* row = matrix.row[0];
  EXPECT_EQ((*row)[0].feat_id, 1);
  EXPECT_EQ((*row)[1].feat_id, 5);
  EXPECT_EQ((*row)[2].feat_id, 7);
  EXPECT_EQ((*row)[3].feat_id, 8);
  // row_1
  row = matrix.row[1];
  EXPECT_EQ((*row)[0].feat_id, 3);
  EXPECT_EQ((*row)[1].feat_id, 10);
  EXPECT_EQ((*row)[2].feat_id, 11);
  // row_2
  row = matrix.row[2];
  EXPECT_EQ((*row)[0].feat_id, 5);
  EXPECT_EQ((*row)[1].feat_id, 7);
  EXPECT_EQ((*row)[2].feat_id, 9);
  // row_3
  row = matrix.row[3];
  EXPECT_EQ((*row)[0].feat_id, 2);
  EXPECT_EQ((*row)[1].feat_id, 4);
  EXPECT_EQ((*row)[2].feat_id, 6);
  // feature list
  EXPECT_EQ(feature_list[0], 1);
  EXPECT_EQ(feature_list[1], 2);
  EXPECT_EQ(feature_list[2], 3);
  EXPECT_EQ(feature_list[3], 4);
  EXPECT_EQ(feature_list[4], 5);
  EXPECT_EQ(feature_list[5], 7);
  EXPECT_EQ(feature_list[6], 8);
  EXPECT_EQ(feature_list[7], 10);
  EXPECT_EQ(feature_list[8], 11);
  EXPECT_EQ(feature_list[9], 12);
  EXPECT_EQ(feature_list[10], 20);
}